

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlChar * xmlSchemaLookupNamespace(xmlSchemaValidCtxtPtr vctxt,xmlChar *prefix)

{
  xmlSchemaNodeInfoPtr pxVar1;
  xmlNodePtr node;
  int iVar2;
  xmlChar *name;
  xmlChar *pxVar3;
  xmlNsPtr pxVar4;
  xmlChar **ppxVar5;
  uint uVar6;
  long lVar7;
  
  if (vctxt->sax == (xmlSAXHandlerPtr)0x0) {
    if (vctxt->reader == (xmlTextReaderPtr)0x0) {
      node = vctxt->inode->node;
      if ((node == (xmlNodePtr)0x0) || (node->doc == (xmlDocPtr)0x0)) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaLookupNamespace",
                   "no node or node\'s doc available");
      }
      else {
        pxVar4 = xmlSearchNs(node->doc,node,prefix);
        if (pxVar4 != (xmlNsPtr)0x0) {
          return pxVar4->href;
        }
      }
    }
    else {
      name = xmlTextReaderLookupNamespace(vctxt->reader,prefix);
      if (name != (xmlChar *)0x0) {
        pxVar3 = xmlDictLookup(vctxt->dict,name,-1);
        (*xmlFree)(name);
        return pxVar3;
      }
    }
  }
  else {
    for (uVar6 = vctxt->depth; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
      pxVar1 = vctxt->elemInfos[uVar6];
      iVar2 = pxVar1->nbNsBindings;
      if (iVar2 != 0) {
        for (lVar7 = 0; lVar7 < iVar2 * 2; lVar7 = lVar7 + 2) {
          ppxVar5 = pxVar1->nsBindings;
          if (prefix == (xmlChar *)0x0) {
            if (ppxVar5[lVar7] == (xmlChar *)0x0) goto LAB_001c0887;
          }
          else {
            iVar2 = xmlStrEqual(prefix,ppxVar5[lVar7]);
            if (iVar2 != 0) {
              ppxVar5 = pxVar1->nsBindings;
LAB_001c0887:
              return ppxVar5[lVar7 + 1];
            }
            iVar2 = pxVar1->nbNsBindings;
          }
        }
      }
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static const xmlChar *
xmlSchemaLookupNamespace(xmlSchemaValidCtxtPtr vctxt,
			 const xmlChar *prefix)
{
    if (vctxt->sax != NULL) {
	int i, j;
	xmlSchemaNodeInfoPtr inode;

	for (i = vctxt->depth; i >= 0; i--) {
	    if (vctxt->elemInfos[i]->nbNsBindings != 0) {
		inode = vctxt->elemInfos[i];
		for (j = 0; j < inode->nbNsBindings * 2; j += 2) {
		    if (((prefix == NULL) &&
			    (inode->nsBindings[j] == NULL)) ||
			((prefix != NULL) && xmlStrEqual(prefix,
			    inode->nsBindings[j]))) {

			/*
			* Note that the namespace bindings are already
			* in a string dict.
			*/
			return (inode->nsBindings[j+1]);
		    }
		}
	    }
	}
	return (NULL);
#ifdef LIBXML_READER_ENABLED
    } else if (vctxt->reader != NULL) {
	xmlChar *nsName;

	nsName = xmlTextReaderLookupNamespace(vctxt->reader, prefix);
	if (nsName != NULL) {
	    const xmlChar *ret;

	    ret = xmlDictLookup(vctxt->dict, nsName, -1);
	    xmlFree(nsName);
	    return (ret);
	} else
	    return (NULL);
#endif
    } else {
	xmlNsPtr ns;

	if ((vctxt->inode->node == NULL) ||
	    (vctxt->inode->node->doc == NULL)) {
	    VERROR_INT("xmlSchemaLookupNamespace",
		"no node or node's doc available");
	    return (NULL);
	}
	ns = xmlSearchNs(vctxt->inode->node->doc,
	    vctxt->inode->node, prefix);
	if (ns != NULL)
	    return (ns->href);
	return (NULL);
    }
}